

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O3

QString * __thiscall
QLocaleData::DataRange::getListEntry
          (QString *__return_storage_ptr__,DataRange *this,char16_t *table,qsizetype index)

{
  DataRange DVar1;
  
  DVar1 = listEntry(this,table,index);
  if ((ulong)DVar1 >> 0x20 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData((QChar *)(table + ((ulong)DVar1 & 0xffffffff)),(ulong)DVar1 >> 0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QString getListEntry(const char16_t *table, qsizetype index) const
        {
            return listEntry(table, index).getData(table);
        }